

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugRnglists.cpp
# Opt level: O2

Error __thiscall
llvm::RangeListEntry::extract
          (RangeListEntry *this,DWARFDataExtractor Data,uint64_t End,uint64_t *OffsetPtr)

{
  uint64_t *SecIx;
  byte bVar1;
  uint64_t uVar2;
  char *pcVar3;
  uint64_t *in_RCX;
  char *Vals;
  error_code EC;
  error_code EC_00;
  error_category *peStack_50;
  uint local_44;
  long local_40;
  uint64_t PreviousOffset;
  
  *(uint64_t *)End = *in_RCX;
  *(undefined8 *)(End + 0x10) = 0xffffffffffffffff;
  PreviousOffset = (uint64_t)this;
  if (OffsetPtr <= (uint64_t *)*in_RCX) {
    __assert_fail("*OffsetPtr < End && \"not enough space to extract a rangelist encoding\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDebugRnglists.cpp"
                  ,0x1a,
                  "Error llvm::RangeListEntry::extract(DWARFDataExtractor, uint64_t, uint64_t *)");
  }
  bVar1 = DataExtractor::getU8(&Data.super_DataExtractor,in_RCX,(Error *)0x0);
  if (7 < bVar1) {
    pcVar3 = (char *)std::_V2::generic_category();
    uVar2 = PreviousOffset;
    local_44 = (uint)bVar1;
    local_40 = *in_RCX - 1;
    EC_00._M_cat = (error_category *)0x5f;
    EC_00._0_8_ = PreviousOffset;
    createStringError<unsigned_int,unsigned_long>
              (EC_00,pcVar3,(uint *)"unknown rnglists encoding 0x%x at offset 0x%lx",
               (unsigned_long *)&local_44);
    return (Error)(ErrorInfoBase *)uVar2;
  }
  SecIx = (uint64_t *)(End + 0x10);
  switch(bVar1) {
  case 0:
    *(undefined8 *)(End + 0x18) = 0;
    *(undefined8 *)(End + 0x20) = 0;
LAB_00d94b1a:
    *(byte *)(End + 8) = bVar1;
    *(undefined8 *)PreviousOffset = 1;
    return (Error)(ErrorInfoBase *)PreviousOffset;
  case 1:
    local_40 = *in_RCX - 1;
    uVar2 = DataExtractor::getULEB128(&Data.super_DataExtractor,in_RCX,(Error *)0x0);
    *(uint64_t *)(End + 0x18) = uVar2;
    if ((uint64_t *)*in_RCX <= OffsetPtr) goto LAB_00d94b1a;
    pcVar3 = (char *)std::_V2::generic_category();
    Vals = "read past end of table when reading DW_RLE_base_addressx encoding at offset 0x%lx";
    break;
  case 2:
    pcVar3 = (char *)std::_V2::generic_category();
    uVar2 = *in_RCX;
    Vals = "unsupported rnglists encoding DW_RLE_startx_endx at offset 0x%lx";
    peStack_50 = (error_category *)0x5f;
    goto LAB_00d94aa5;
  case 3:
    local_40 = *in_RCX - 1;
    uVar2 = DataExtractor::getULEB128(&Data.super_DataExtractor,in_RCX,(Error *)0x0);
    *(uint64_t *)(End + 0x18) = uVar2;
    uVar2 = DataExtractor::getULEB128(&Data.super_DataExtractor,in_RCX,(Error *)0x0);
    *(uint64_t *)(End + 0x20) = uVar2;
    if ((uint64_t *)*in_RCX <= OffsetPtr) goto LAB_00d94b1a;
    pcVar3 = (char *)std::_V2::generic_category();
    Vals = "read past end of table when reading DW_RLE_startx_length encoding at offset 0x%lx";
    break;
  case 4:
    local_40 = *in_RCX - 1;
    uVar2 = DataExtractor::getULEB128(&Data.super_DataExtractor,in_RCX,(Error *)0x0);
    *(uint64_t *)(End + 0x18) = uVar2;
    uVar2 = DataExtractor::getULEB128(&Data.super_DataExtractor,in_RCX,(Error *)0x0);
    *(uint64_t *)(End + 0x20) = uVar2;
    if ((uint64_t *)*in_RCX <= OffsetPtr) goto LAB_00d94b1a;
    pcVar3 = (char *)std::_V2::generic_category();
    Vals = "read past end of table when reading DW_RLE_offset_pair encoding at offset 0x%lx";
    break;
  case 5:
    uVar2 = *in_RCX;
    if ((ulong)Data.super_DataExtractor.AddressSize <= (long)OffsetPtr - uVar2) {
      uVar2 = DWARFDataExtractor::getRelocatedAddress(&Data,in_RCX,SecIx);
      *(uint64_t *)(End + 0x18) = uVar2;
      goto LAB_00d94b1a;
    }
    pcVar3 = (char *)std::_V2::generic_category();
    Vals = "insufficient space remaining in table for DW_RLE_base_address encoding at offset 0x%lx";
    goto LAB_00d94aa3;
  case 6:
    uVar2 = *in_RCX;
    if ((ulong)((uint)Data.super_DataExtractor.AddressSize * 2) <= (long)OffsetPtr - uVar2) {
      uVar2 = DWARFDataExtractor::getRelocatedAddress(&Data,in_RCX,SecIx);
      *(uint64_t *)(End + 0x18) = uVar2;
      uVar2 = DWARFDataExtractor::getRelocatedAddress(&Data,in_RCX,(uint64_t *)0x0);
      *(uint64_t *)(End + 0x20) = uVar2;
      goto LAB_00d94b1a;
    }
    pcVar3 = (char *)std::_V2::generic_category();
    Vals = "insufficient space remaining in table for DW_RLE_start_end encoding at offset 0x%lx";
LAB_00d94aa3:
    peStack_50 = (error_category *)0x16;
LAB_00d94aa5:
    local_40 = uVar2 - 1;
    goto LAB_00d94aa6;
  case 7:
    local_40 = *in_RCX - 1;
    uVar2 = DWARFDataExtractor::getRelocatedAddress(&Data,in_RCX,SecIx);
    *(uint64_t *)(End + 0x18) = uVar2;
    uVar2 = DataExtractor::getULEB128(&Data.super_DataExtractor,in_RCX,(Error *)0x0);
    *(uint64_t *)(End + 0x20) = uVar2;
    if ((uint64_t *)*in_RCX <= OffsetPtr) goto LAB_00d94b1a;
    pcVar3 = (char *)std::_V2::generic_category();
    Vals = "read past end of table when reading DW_RLE_start_length encoding at offset 0x%lx";
  }
  peStack_50 = (error_category *)0x16;
LAB_00d94aa6:
  uVar2 = PreviousOffset;
  EC._M_cat = peStack_50;
  EC._0_8_ = PreviousOffset;
  createStringError<unsigned_long>(EC,pcVar3,(unsigned_long *)Vals);
  return (Error)(ErrorInfoBase *)uVar2;
}

Assistant:

Error RangeListEntry::extract(DWARFDataExtractor Data, uint64_t End,
                              uint64_t *OffsetPtr) {
  Offset = *OffsetPtr;
  SectionIndex = -1ULL;
  // The caller should guarantee that we have at least 1 byte available, so
  // we just assert instead of revalidate.
  assert(*OffsetPtr < End &&
         "not enough space to extract a rangelist encoding");
  uint8_t Encoding = Data.getU8(OffsetPtr);

  switch (Encoding) {
  case dwarf::DW_RLE_end_of_list:
    Value0 = Value1 = 0;
    break;
  // TODO: Support other encodings.
  case dwarf::DW_RLE_base_addressx: {
    uint64_t PreviousOffset = *OffsetPtr - 1;
    Value0 = Data.getULEB128(OffsetPtr);
    if (End < *OffsetPtr)
      return createStringError(
          errc::invalid_argument,
          "read past end of table when reading "
          "DW_RLE_base_addressx encoding at offset 0x%" PRIx64,
          PreviousOffset);
    break;
  }
  case dwarf::DW_RLE_startx_endx:
    return createStringError(errc::not_supported,
                       "unsupported rnglists encoding DW_RLE_startx_endx at "
                       "offset 0x%" PRIx64,
                       *OffsetPtr - 1);
  case dwarf::DW_RLE_startx_length: {
    uint64_t PreviousOffset = *OffsetPtr - 1;
    Value0 = Data.getULEB128(OffsetPtr);
    Value1 = Data.getULEB128(OffsetPtr);
    if (End < *OffsetPtr)
      return createStringError(
          errc::invalid_argument,
          "read past end of table when reading "
          "DW_RLE_startx_length encoding at offset 0x%" PRIx64,
          PreviousOffset);
    break;
  }
  case dwarf::DW_RLE_offset_pair: {
    uint64_t PreviousOffset = *OffsetPtr - 1;
    Value0 = Data.getULEB128(OffsetPtr);
    Value1 = Data.getULEB128(OffsetPtr);
    if (End < *OffsetPtr)
      return createStringError(errc::invalid_argument,
                         "read past end of table when reading "
                         "DW_RLE_offset_pair encoding at offset 0x%" PRIx64,
                         PreviousOffset);
    break;
  }
  case dwarf::DW_RLE_base_address: {
    if ((End - *OffsetPtr) < Data.getAddressSize())
      return createStringError(errc::invalid_argument,
                         "insufficient space remaining in table for "
                         "DW_RLE_base_address encoding at offset 0x%" PRIx64,
                         *OffsetPtr - 1);
    Value0 = Data.getRelocatedAddress(OffsetPtr, &SectionIndex);
    break;
  }
  case dwarf::DW_RLE_start_end: {
    if ((End - *OffsetPtr) < unsigned(Data.getAddressSize() * 2))
      return createStringError(errc::invalid_argument,
                         "insufficient space remaining in table for "
                         "DW_RLE_start_end encoding "
                         "at offset 0x%" PRIx64,
                         *OffsetPtr - 1);
    Value0 = Data.getRelocatedAddress(OffsetPtr, &SectionIndex);
    Value1 = Data.getRelocatedAddress(OffsetPtr);
    break;
  }
  case dwarf::DW_RLE_start_length: {
    uint64_t PreviousOffset = *OffsetPtr - 1;
    Value0 = Data.getRelocatedAddress(OffsetPtr, &SectionIndex);
    Value1 = Data.getULEB128(OffsetPtr);
    if (End < *OffsetPtr)
      return createStringError(errc::invalid_argument,
                         "read past end of table when reading "
                         "DW_RLE_start_length encoding at offset 0x%" PRIx64,
                         PreviousOffset);
    break;
  }
  default:
    return createStringError(errc::not_supported,
                       "unknown rnglists encoding 0x%" PRIx32
                       " at offset 0x%" PRIx64,
                       uint32_t(Encoding), *OffsetPtr - 1);
  }

  EntryKind = Encoding;
  return Error::success();
}